

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_any_tests.cpp
# Opt level: O3

void deque_int(void)

{
  deque<int,_std::allocator<int>_> s;
  stringstream ss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_218;
  Assert local_1f8;
  _Deque_base<int,_std::allocator<int>_> local_1e8;
  undefined8 local_198;
  undefined8 uStack_190;
  ostream local_188 [112];
  ios_base local_118 [272];
  
  local_198 = 0x100000000;
  uStack_190 = 0x9c00000002;
  local_1e8._M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  local_1e8._M_impl.super__Deque_impl_data._M_map_size = 0;
  local_1e8._M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  local_1e8._M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  local_1e8._M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  local_1e8._M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  local_1e8._M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  std::deque<int,std::allocator<int>>::_M_range_initialize<int_const*>
            ((deque<int,std::allocator<int>> *)&local_1e8,&local_198);
  std::__cxx11::stringstream::stringstream((stringstream *)&local_198);
  UnitTests::stream_any_details::output_range_or_type<std::deque<int,std::allocator<int>>>
            (local_188,(deque<int,_std::allocator<int>_> *)&local_1e8,(true_type *)&local_218);
  local_1f8.m_file =
       "/workspace/llm4binary/github/license_all_cmakelists_25/john-mullins[P]TestFramework/tests/stream_any_tests.cpp"
  ;
  local_1f8.m_line = 0x7a;
  std::__cxx11::stringbuf::str();
  UnitTests::Assert::Equals<char[15],std::__cxx11::string>
            (&local_1f8,(char (*) [15])"[0, 1, 2, 156]",&local_218);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_198);
  std::ios_base::~ios_base(local_118);
  std::_Deque_base<int,_std::allocator<int>_>::~_Deque_base(&local_1e8);
  return;
}

Assistant:

TEST(deque_int)
{
    auto s  = std::deque<int>{0, 1, 2, 156};
    auto ss = std::stringstream{};
    ss << UnitTests::stream_any(s);
    ASSERT_EQUALS("[0, 1, 2, 156]", ss.str());
}